

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SnippetShift(Fts3Table *pTab,int iLangid,int nSnippet,char *zDoc,int nDoc,int *piPos,
                    u64 *pHlmask)

{
  int iVar1;
  undefined4 local_7c;
  undefined4 local_78;
  int DUMMY3;
  int DUMMY2;
  int DUMMY1;
  char *ZDUMMY;
  sqlite3_tokenizer_cursor *pC;
  sqlite3_tokenizer_module *pMod;
  int rc;
  int iCurrent;
  int nShift;
  int nDesired;
  int nRight;
  int nLeft;
  u64 hlmask;
  int *piPos_local;
  char *pcStack_28;
  int nDoc_local;
  char *zDoc_local;
  int nSnippet_local;
  int iLangid_local;
  Fts3Table *pTab_local;
  
  _nRight = *pHlmask;
  if (_nRight != 0) {
    nDesired = 0;
    while ((_nRight & 1L << ((byte)nDesired & 0x3f)) == 0) {
      nDesired = nDesired + 1;
    }
    nShift = 0;
    while ((_nRight & 1L << (((char)nSnippet + -1) - (char)nShift & 0x3fU)) == 0) {
      nShift = nShift + 1;
    }
    iCurrent = (nDesired - nShift) / 2;
    if (0 < iCurrent) {
      pMod._4_4_ = 0;
      pC = (sqlite3_tokenizer_cursor *)pTab->pTokenizer->pModule;
      hlmask = (u64)piPos;
      piPos_local._4_4_ = nDoc;
      pcStack_28 = zDoc;
      zDoc_local._0_4_ = nSnippet;
      zDoc_local._4_4_ = iLangid;
      _nSnippet_local = pTab;
      pMod._0_4_ = sqlite3Fts3OpenTokenizer
                             (pTab->pTokenizer,iLangid,zDoc,nDoc,
                              (sqlite3_tokenizer_cursor **)&ZDUMMY);
      if ((int)pMod != 0) {
        return (int)pMod;
      }
      while ((int)pMod == 0 && pMod._4_4_ < (int)zDoc_local + iCurrent) {
        DUMMY3 = 0;
        local_78 = 0;
        local_7c = 0;
        pMod._0_4_ = (*(code *)pC[5].pTokenizer)
                               (ZDUMMY,&DUMMY2,&DUMMY3,&local_78,&local_7c,(long)&pMod + 4);
      }
      (*(code *)pC[4].pTokenizer)(ZDUMMY);
      if (((int)pMod != 0) && ((int)pMod != 0x65)) {
        return (int)pMod;
      }
      iVar1 = ((uint)((int)pMod == 0x65) + pMod._4_4_) - (int)zDoc_local;
      if (0 < iVar1) {
        *(int *)hlmask = iVar1 + *(int *)hlmask;
        *pHlmask = _nRight >> ((byte)iVar1 & 0x3f);
      }
    }
  }
  return 0;
}

Assistant:

static int fts3SnippetShift(
  Fts3Table *pTab,                /* FTS3 table snippet comes from */
  int iLangid,                    /* Language id to use in tokenizing */
  int nSnippet,                   /* Number of tokens desired for snippet */
  const char *zDoc,               /* Document text to extract snippet from */
  int nDoc,                       /* Size of buffer zDoc in bytes */
  int *piPos,                     /* IN/OUT: First token of snippet */
  u64 *pHlmask                    /* IN/OUT: Mask of tokens to highlight */
){
  u64 hlmask = *pHlmask;          /* Local copy of initial highlight-mask */

  if( hlmask ){
    int nLeft;                    /* Tokens to the left of first highlight */
    int nRight;                   /* Tokens to the right of last highlight */
    int nDesired;                 /* Ideal number of tokens to shift forward */

    for(nLeft=0; !(hlmask & ((u64)1 << nLeft)); nLeft++);
    for(nRight=0; !(hlmask & ((u64)1 << (nSnippet-1-nRight))); nRight++);
    assert( (nSnippet-1-nRight)<=63 && (nSnippet-1-nRight)>=0 );
    nDesired = (nLeft-nRight)/2;

    /* Ideally, the start of the snippet should be pushed forward in the
    ** document nDesired tokens. This block checks if there are actually
    ** nDesired tokens to the right of the snippet. If so, *piPos and
    ** *pHlMask are updated to shift the snippet nDesired tokens to the
    ** right. Otherwise, the snippet is shifted by the number of tokens
    ** available.
    */
    if( nDesired>0 ){
      int nShift;                 /* Number of tokens to shift snippet by */
      int iCurrent = 0;           /* Token counter */
      int rc;                     /* Return Code */
      sqlite3_tokenizer_module *pMod;
      sqlite3_tokenizer_cursor *pC;
      pMod = (sqlite3_tokenizer_module *)pTab->pTokenizer->pModule;

      /* Open a cursor on zDoc/nDoc. Check if there are (nSnippet+nDesired)
      ** or more tokens in zDoc/nDoc.
      */
      rc = sqlite3Fts3OpenTokenizer(pTab->pTokenizer, iLangid, zDoc, nDoc, &pC);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      while( rc==SQLITE_OK && iCurrent<(nSnippet+nDesired) ){
        const char *ZDUMMY; int DUMMY1 = 0, DUMMY2 = 0, DUMMY3 = 0;
        rc = pMod->xNext(pC, &ZDUMMY, &DUMMY1, &DUMMY2, &DUMMY3, &iCurrent);
      }
      pMod->xClose(pC);
      if( rc!=SQLITE_OK && rc!=SQLITE_DONE ){ return rc; }

      nShift = (rc==SQLITE_DONE)+iCurrent-nSnippet;
      assert( nShift<=nDesired );
      if( nShift>0 ){
        *piPos += nShift;
        *pHlmask = hlmask >> nShift;
      }
    }
  }
  return SQLITE_OK;
}